

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effects.c
# Opt level: O0

int32_t effect_value_base_spell_power(void)

{
  monster_conflict *pmVar1;
  wchar_t local_c;
  wchar_t power;
  
  local_c = L'\0';
  if (ref_race == (monster_race *)0x0) {
    if (L'\0' < cave->mon_current) {
      pmVar1 = cave_monster(cave,cave->mon_current);
      local_c = pmVar1->race->spell_power;
    }
  }
  else {
    local_c = ref_race->spell_power;
  }
  return local_c;
}

Assistant:

static int32_t effect_value_base_spell_power(void)
{
	int power = 0;

	/* Check the reference race first */
	if (ref_race)
	   power = ref_race->spell_power;
	/* Otherwise the current monster if there is one */
	else if (cave->mon_current > 0)
		power = cave_monster(cave, cave->mon_current)->race->spell_power;

	return power;
}